

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureImmutableLevelsCase::test
          (TextureImmutableLevelsCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  ScopedLogSection SVar1;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  GetNameFunc local_628;
  int local_620;
  string local_618;
  allocator<char> local_5f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  GLenum local_56c;
  GetNameFunc p_Stack_568;
  deUint32 err_5;
  int local_560;
  GetNameFunc local_558;
  int local_550;
  string local_548;
  allocator<char> local_521;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  GLenum local_49c;
  GetNameFunc p_Stack_498;
  deUint32 err_4;
  int local_490;
  GetNameFunc local_488;
  int local_480;
  string local_478;
  allocator<char> local_451;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  GLenum local_3d0;
  GLuint local_3cc;
  deUint32 err_3;
  GLuint textureID_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  allocator<char> local_381;
  string local_380;
  ScopedLogSection local_360;
  ScopedLogSection section_2;
  int level;
  GetNameFunc local_340;
  int local_338;
  string local_330;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  GLenum local_284;
  GetNameFunc p_Stack_280;
  deUint32 err_2;
  int local_278;
  GetNameFunc local_270;
  int local_268;
  string local_260;
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  GLenum local_1b4;
  GetNameFunc p_Stack_1b0;
  deUint32 err_1;
  int local_1a8;
  GetNameFunc local_1a0;
  int local_198;
  string local_190;
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  GLenum local_e4;
  GLuint local_e0;
  deUint32 err;
  GLuint textureID;
  allocator<char> local_b1;
  string local_b0;
  ScopedLogSection local_90;
  ScopedLogSection section_1;
  string local_80;
  allocator<char> local_49;
  string local_48;
  ScopedLogSection local_28;
  ScopedLogSection section;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  TextureImmutableLevelsCase *this_local;
  
  section.m_log = (TestLog *)result;
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Initial",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_28,pTVar3,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  StateQueryUtil::verifyStateTextureParamInteger
            ((ResultCollector *)section.m_log,gl,(this->super_TextureTest).m_target,
             (this->super_TextureTest).m_pname,0,(this->super_TextureTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&local_28);
  if (((this->super_TextureTest).m_target == 0x9100) ||
     ((this->super_TextureTest).m_target == 0x9102)) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Level",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&textureID,"Level",(allocator<char> *)((long)&err + 3));
    tcu::ScopedLogSection::ScopedLogSection(&local_90,pTVar3,&local_b0,(string *)&textureID);
    std::__cxx11::string::~string((string *)&textureID);
    std::allocator<char>::~allocator((allocator<char> *)((long)&err + 3));
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    local_e0 = 0;
    glu::CallLogWrapper::glGenTextures(gl,1,&local_e0);
    glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_e0);
    do {
      local_e4 = glu::CallLogWrapper::glGetError(gl);
      SVar1 = section;
      if (local_e4 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"Got Error ",&local_169);
        EVar4 = glu::getErrorStr(local_e4);
        p_Stack_1b0 = EVar4.m_getName;
        local_1a8 = EVar4.m_value;
        local_1a0 = p_Stack_1b0;
        local_198 = local_1a8;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_190,&local_1a0);
        std::operator+(&local_148,&local_168,&local_190);
        std::operator+(&local_128,&local_148,": ");
        std::operator+(&local_108,&local_128,"glBindTexture");
        tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if ((this->super_TextureTest).m_target == 0x9100) {
      glu::CallLogWrapper::glTexStorage2DMultisample
                (gl,(this->super_TextureTest).m_target,2,0x8051,0x40,0x40,'\0');
    }
    else if ((this->super_TextureTest).m_target == 0x9102) {
      glu::CallLogWrapper::glTexStorage3DMultisample
                (gl,(this->super_TextureTest).m_target,2,0x8051,0x40,0x40,2,'\0');
    }
    do {
      local_1b4 = glu::CallLogWrapper::glGetError(gl);
      SVar1 = section;
      if (local_1b4 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"Got Error ",&local_239);
        EVar4 = glu::getErrorStr(local_1b4);
        p_Stack_280 = EVar4.m_getName;
        local_278 = EVar4.m_value;
        local_270 = p_Stack_280;
        local_268 = local_278;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_270);
        std::operator+(&local_218,&local_238,&local_260);
        std::operator+(&local_1f8,&local_218,": ");
        std::operator+(&local_1d8,&local_1f8,"glTexStorage");
        tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator(&local_239);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              ((ResultCollector *)section.m_log,gl,(this->super_TextureTest).m_target,
               (this->super_TextureTest).m_pname,1,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glDeleteTextures(gl,1,&local_e0);
    do {
      local_284 = glu::CallLogWrapper::glGetError(gl);
      SVar1 = section;
      if (local_284 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_308,"Got Error ",&local_309);
        EVar4 = glu::getErrorStr(local_284);
        local_340 = EVar4.m_getName;
        local_338 = EVar4.m_value;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_330,&local_340);
        std::operator+(&local_2e8,&local_308,&local_330);
        std::operator+(&local_2c8,&local_2e8,": ");
        std::operator+(&local_2a8,&local_2c8,"glDeleteTextures");
        tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_308);
        std::allocator<char>::~allocator(&local_309);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    tcu::ScopedLogSection::~ScopedLogSection(&local_90);
  }
  else {
    for (section_2.m_log._4_4_ = 1; section_2.m_log._4_4_ < 8;
        section_2.m_log._4_4_ = section_2.m_log._4_4_ + 1) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"Levels",&local_381);
      de::toString<int>((string *)&err_3,(int *)((long)&section_2.m_log + 4));
      std::operator+(&local_3a8,"Levels = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err_3);
      tcu::ScopedLogSection::ScopedLogSection(&local_360,pTVar3,&local_380,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&err_3);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator(&local_381);
      local_3cc = 0;
      glu::CallLogWrapper::glGenTextures(gl,1,&local_3cc);
      glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_3cc);
      do {
        local_3d0 = glu::CallLogWrapper::glGetError(gl);
        SVar1 = section;
        if (local_3d0 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,"Got Error ",&local_451);
          EVar4 = glu::getErrorStr(local_3d0);
          p_Stack_498 = EVar4.m_getName;
          local_490 = EVar4.m_value;
          local_488 = p_Stack_498;
          local_480 = local_490;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_478,&local_488);
          std::operator+(&local_430,&local_450,&local_478);
          std::operator+(&local_410,&local_430,": ");
          std::operator+(&local_3f0,&local_410,"glBindTexture");
          tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_3f0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_450);
          std::allocator<char>::~allocator(&local_451);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (((this->super_TextureTest).m_target == 0xde1) ||
         ((this->super_TextureTest).m_target == 0x8513)) {
        glu::CallLogWrapper::glTexStorage2D
                  (gl,(this->super_TextureTest).m_target,section_2.m_log._4_4_,0x8051,0x40,0x40);
      }
      else if (((this->super_TextureTest).m_target == 0x8c1a) ||
              ((this->super_TextureTest).m_target == 0x806f)) {
        glu::CallLogWrapper::glTexStorage3D
                  (gl,(this->super_TextureTest).m_target,section_2.m_log._4_4_,0x8051,0x40,0x40,0x40
                  );
      }
      else if ((this->super_TextureTest).m_target == 0x9009) {
        glu::CallLogWrapper::glTexStorage3D
                  (gl,(this->super_TextureTest).m_target,section_2.m_log._4_4_,0x8051,0x40,0x40,0xc)
        ;
      }
      do {
        local_49c = glu::CallLogWrapper::glGetError(gl);
        SVar1 = section;
        if (local_49c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_520,"Got Error ",&local_521);
          EVar4 = glu::getErrorStr(local_49c);
          p_Stack_568 = EVar4.m_getName;
          local_560 = EVar4.m_value;
          local_558 = p_Stack_568;
          local_550 = local_560;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_548,&local_558);
          std::operator+(&local_500,&local_520,&local_548);
          std::operator+(&local_4e0,&local_500,": ");
          std::operator+(&local_4c0,&local_4e0,"glTexStorage");
          tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_4c0);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_500);
          std::__cxx11::string::~string((string *)&local_548);
          std::__cxx11::string::~string((string *)&local_520);
          std::allocator<char>::~allocator(&local_521);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      StateQueryUtil::verifyStateTextureParamInteger
                ((ResultCollector *)section.m_log,gl,(this->super_TextureTest).m_target,
                 (this->super_TextureTest).m_pname,section_2.m_log._4_4_,
                 (this->super_TextureTest).m_type);
      glu::CallLogWrapper::glDeleteTextures(gl,1,&local_3cc);
      do {
        local_56c = glu::CallLogWrapper::glGetError(gl);
        SVar1 = section;
        if (local_56c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5f0,"Got Error ",&local_5f1);
          EVar4 = glu::getErrorStr(local_56c);
          local_628 = EVar4.m_getName;
          local_620 = EVar4.m_value;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_618,&local_628);
          std::operator+(&local_5d0,&local_5f0,&local_618);
          std::operator+(&local_5b0,&local_5d0,": ");
          std::operator+(&local_590,&local_5b0,"glDeleteTextures");
          tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_590);
          std::__cxx11::string::~string((string *)&local_590);
          std::__cxx11::string::~string((string *)&local_5b0);
          std::__cxx11::string::~string((string *)&local_5d0);
          std::__cxx11::string::~string((string *)&local_618);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::allocator<char>::~allocator(&local_5f1);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      tcu::ScopedLogSection::~ScopedLogSection(&local_360);
    }
  }
  return;
}

Assistant:

void TextureImmutableLevelsCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);
	}

	if (m_target == GL_TEXTURE_2D_MULTISAMPLE		||
		m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		// no levels
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Level", "Level");
		GLuint						textureID	= 0;

		gl.glGenTextures(1, &textureID);
		gl.glBindTexture(m_target, textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		if (m_target == GL_TEXTURE_2D_MULTISAMPLE)
			gl.glTexStorage2DMultisample(m_target, 2, GL_RGB8, 64, 64, GL_FALSE);
		else if (m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
			gl.glTexStorage3DMultisample(m_target, 2, GL_RGB8, 64, 64, 2, GL_FALSE);
		else
			DE_ASSERT(false);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexStorage");

		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 1, m_type);

		gl.glDeleteTextures(1, &textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
	}
	else
	{
		for (int level = 1; level <= 7; ++level)
		{
			const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Levels", "Levels = " + de::toString(level));
			GLuint						textureID	= 0;

			gl.glGenTextures(1, &textureID);
			gl.glBindTexture(m_target, textureID);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

			if (m_target == GL_TEXTURE_2D || m_target == GL_TEXTURE_CUBE_MAP)
				gl.glTexStorage2D(m_target, level, GL_RGB8, 64, 64);
			else if (m_target == GL_TEXTURE_2D_ARRAY || m_target == GL_TEXTURE_3D)
				gl.glTexStorage3D(m_target, level, GL_RGB8, 64, 64, 64);
			else if (m_target == GL_TEXTURE_CUBE_MAP_ARRAY)
				gl.glTexStorage3D(m_target, level, GL_RGB8, 64, 64, 6 * 2);
			else
				DE_ASSERT(false);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexStorage");

			verifyStateTextureParamInteger(result, gl, m_target, m_pname, level, m_type);

			gl.glDeleteTextures(1, &textureID);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
		}
	}
}